

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O2

void __thiscall xray_re::xr_scene_visuals::~xr_scene_visuals(xr_scene_visuals *this)

{
  (this->super_xr_scene_objects).super_xr_scene_part._vptr_xr_scene_part =
       (_func_int **)&PTR__xr_scene_visuals_0023a1b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_snap_objects);
  xr_scene_objects::~xr_scene_objects(&this->super_xr_scene_objects);
  return;
}

Assistant:

void xr_scene_visuals::load(xr_reader& r)
{
	uint16_t version = 0;
	r.r_chunk<uint16_t>(TOOLS_CHUNK_VERSION, version);
	xr_assert(version == 0);
	xr_scene_objects::load(r);
	r.r_chunk<uint32_t>(SCENEOBJS_CHUNK_COMMON_FLAGS, m_flags);
	if (r.find_chunk(SCENEOBJS_CHUNK_COMMON_PARAMS)) {
		r.r_fvector3(m_min_scale);
		r.r_fvector3(m_max_scale);
		r.r_fvector3(m_min_rotate);
		r.r_fvector3(m_max_rotate);
		r.r_seq(r.r_u32(), m_snap_objects, xr_reader::f_r_sz());
	}
}